

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t *
Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pObj_00;
  int i;
  
  p_00 = Vec_IntAlloc(vNodeFrames->nSize * 2);
  i = 0;
  do {
    if (vNodeFrames->nSize <= i) {
      if (p_00->nSize == vNodeFrames->nSize * 2) {
        return p_00;
      }
      __assert_fail("Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                    ,0x164,
                    "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar2 = Vec_IntEntry(vNodeFrames,i);
    pObj = Wlc_NtkObj(p,iVar2 >> 0xb);
    if ((*(ushort *)pObj & 0x3f) - 0x36 < 2) {
      pObj_00 = Wlc_ObjFanin1(p,pObj);
    }
    else {
      if ((*(ushort *)pObj & 0x3f) != 8) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x158,
                      "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pObj_00 = Wlc_ObjFanin0(p,pObj);
    }
    iVar2 = Wlc_NtkDupOneObject(pNew,p,pObj_00,3,vFanins);
    Vec_IntPush(p_00,iVar2);
    uVar1 = *(ushort *)pObj & 0x3f;
    iVar2 = 0;
    if (uVar1 != 8) {
      if (uVar1 != 0x36) {
        if (uVar1 != 0x37) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x161,
                        "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        pObj = Wlc_ObjFanin2(p,pObj);
        if (pObj == (Wlc_Obj_t *)0x0) goto LAB_0030064c;
      }
      iVar2 = Wlc_NtkDupOneObject(pNew,p,pObj,3,vFanins);
    }
LAB_0030064c:
    Vec_IntPush(p_00,iVar2);
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkAbsCreateFlopOutputs( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins ) 
{
    Vec_Int_t * vNewObjs = Vec_IntAlloc( 2*Vec_IntSize(vNodeFrames) );
    Wlc_Obj_t * pObj, * pFanin = NULL;
    int i, Entry, iObj, iFrame;
    Vec_IntForEachEntry( vNodeFrames, Entry, i )
    {
        iObj   = Entry >> 11;
        iFrame = (Entry >> 1) & 0x3FF;
        pObj   = Wlc_NtkObj( p, iObj );
        // address
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            pFanin = Wlc_ObjFanin0(p, pObj);
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
            pFanin = Wlc_ObjFanin1(p, pObj);
        else assert( 0 );
        Vec_IntPush( vNewObjs, Wlc_NtkDupOneObject(pNew, p, pFanin, WLC_OBJ_FO, vFanins) );
        // data
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            pFanin = NULL;
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
            pFanin = pObj;
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
            pFanin = Wlc_ObjFanin2(p, pObj);
        else assert( 0 );
        Vec_IntPush( vNewObjs, pFanin ? Wlc_NtkDupOneObject(pNew, p, pFanin, WLC_OBJ_FO, vFanins) : 0 );
    }
    assert( Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames) );
    return vNewObjs;
}